

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  ReconnectingHub reconnectingHub;
  allocator<char> local_d1;
  string local_d0;
  ReconnectingHub local_b0;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage ",6);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106108);
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," target",7);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,argv[1],&local_d1);
  ReconnectingHub::ReconnectingHub(&local_b0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  do {
    ReconnectingHub::stepAndReconnect(&local_b0);
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	try
	{
		if (argc > 1)
		{
			ReconnectingHub reconnectingHub(argv[1]);
			while (true)
			{
				reconnectingHub.stepAndReconnect();
			}
		}
		else
		{
			cerr << "Usage " << argv[0] << " target" << endl;
			return 1;
		}
	}
	catch (const DashelException& e)
	{
		cerr << e.what() << endl;
	}

	return 0;
}